

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t
internal_exr_validate_shared_attrs
          (exr_context_t ctxt,exr_priv_part_t basepart,exr_priv_part_t curpart,int curpartidx,
          char **mismatchattr,int *mismatchcount)

{
  exr_attribute_t *peVar1;
  exr_attribute_t *peVar2;
  exr_attr_box2i_t *peVar3;
  exr_attr_box2i_t *peVar4;
  exr_attr_chromaticities_t *peVar5;
  exr_attr_chromaticities_t *peVar6;
  exr_result_t eVar7;
  exr_result_t eVar8;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  exr_attribute_t *cattr;
  exr_attribute_t *battr;
  exr_attribute_t *local_48;
  exr_attribute_t *local_40;
  int *local_38;
  
  peVar1 = basepart->displayWindow;
  peVar2 = curpart->displayWindow;
  if (peVar1 == (exr_attribute_t *)0x0) {
    if (peVar2 != (exr_attribute_t *)0x0) goto LAB_00133a41;
LAB_00133a38:
    uVar10 = 0;
  }
  else {
    if (((peVar2 != (exr_attribute_t *)0x0) && (peVar1->type == EXR_ATTR_BOX2I)) &&
       (peVar2->type == EXR_ATTR_BOX2I)) {
      peVar3 = (peVar1->field_6).box2i;
      peVar4 = (peVar2->field_6).box2i;
      auVar12[0] = -((char)(peVar4->min).x == (char)(peVar3->min).x);
      auVar12[1] = -(*(char *)((long)&(peVar4->min).x + 1) == *(char *)((long)&(peVar3->min).x + 1))
      ;
      auVar12[2] = -(*(char *)((long)&(peVar4->min).x + 2) == *(char *)((long)&(peVar3->min).x + 2))
      ;
      auVar12[3] = -(*(char *)((long)&(peVar4->min).x + 3) == *(char *)((long)&(peVar3->min).x + 3))
      ;
      auVar12[4] = -((char)(peVar4->min).y == (char)(peVar3->min).y);
      auVar12[5] = -(*(char *)((long)&(peVar4->min).y + 1) == *(char *)((long)&(peVar3->min).y + 1))
      ;
      auVar12[6] = -(*(char *)((long)&(peVar4->min).y + 2) == *(char *)((long)&(peVar3->min).y + 2))
      ;
      auVar12[7] = -(*(char *)((long)&(peVar4->min).y + 3) == *(char *)((long)&(peVar3->min).y + 3))
      ;
      auVar12[8] = -((char)(peVar4->max).x == (char)(peVar3->max).x);
      auVar12[9] = -(*(char *)((long)&(peVar4->max).x + 1) == *(char *)((long)&(peVar3->max).x + 1))
      ;
      auVar12[10] = -(*(char *)((long)&(peVar4->max).x + 2) == *(char *)((long)&(peVar3->max).x + 2)
                     );
      auVar12[0xb] = -(*(char *)((long)&(peVar4->max).x + 3) ==
                      *(char *)((long)&(peVar3->max).x + 3));
      auVar12[0xc] = -((char)(peVar4->max).y == (char)(peVar3->max).y);
      auVar12[0xd] = -(*(char *)((long)&(peVar4->max).y + 1) ==
                      *(char *)((long)&(peVar3->max).y + 1));
      auVar12[0xe] = -(*(char *)((long)&(peVar4->max).y + 2) ==
                      *(char *)((long)&(peVar3->max).y + 2));
      auVar12[0xf] = -(*(char *)((long)&(peVar4->max).y + 3) ==
                      *(char *)((long)&(peVar3->max).y + 3));
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar12[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00133a38;
    }
LAB_00133a41:
    *mismatchattr = "displayWindow";
    uVar10 = 1;
  }
  peVar1 = basepart->pixelAspectRatio;
  peVar2 = curpart->pixelAspectRatio;
  if (peVar1 == (exr_attribute_t *)0x0) {
    if (peVar2 != (exr_attribute_t *)0x0) goto LAB_00133a7d;
  }
  else if (((peVar2 == (exr_attribute_t *)0x0) || (peVar1->type != EXR_ATTR_FLOAT)) ||
          ((peVar2->type != EXR_ATTR_FLOAT || ((peVar1->field_6).i != (peVar2->field_6).i)))) {
LAB_00133a7d:
    mismatchattr[uVar10] = "pixelAspectRatio";
    uVar10 = (ulong)((int)uVar10 + 1);
  }
  local_38 = mismatchcount;
  eVar7 = exr_get_attribute_by_name(ctxt,0,"timecode",&local_40);
  eVar8 = exr_get_attribute_by_name(ctxt,curpartidx,"timecode",&local_48);
  if (eVar7 == 0 && eVar8 == 0) {
    if (((local_40->type != EXR_ATTR_TIMECODE) || (local_48->type != EXR_ATTR_TIMECODE)) ||
       (((local_40->field_6).box2i)->min != ((local_48->field_6).box2i)->min)) {
LAB_00133ae8:
      mismatchattr[uVar10] = "timecode";
      uVar10 = (ulong)((int)uVar10 + 1);
    }
  }
  else if (eVar8 == 0) goto LAB_00133ae8;
  iVar9 = (int)uVar10;
  eVar7 = exr_get_attribute_by_name(ctxt,0,"chromaticities",&local_40);
  eVar8 = exr_get_attribute_by_name(ctxt,curpartidx,"chromaticities",&local_48);
  if (eVar7 == 0 && eVar8 == 0) {
    if ((local_40->type == EXR_ATTR_CHROMATICITIES) && (local_48->type == EXR_ATTR_CHROMATICITIES))
    {
      peVar5 = (local_40->field_6).chromaticities;
      peVar6 = (local_48->field_6).chromaticities;
      auVar13[0] = -(*(char *)&peVar6->red_x == *(char *)&peVar5->red_x);
      auVar13[1] = -(*(char *)((long)&peVar6->red_x + 1) == *(char *)((long)&peVar5->red_x + 1));
      auVar13[2] = -(*(char *)((long)&peVar6->red_x + 2) == *(char *)((long)&peVar5->red_x + 2));
      auVar13[3] = -(*(char *)((long)&peVar6->red_x + 3) == *(char *)((long)&peVar5->red_x + 3));
      auVar13[4] = -(*(char *)&peVar6->red_y == *(char *)&peVar5->red_y);
      auVar13[5] = -(*(char *)((long)&peVar6->red_y + 1) == *(char *)((long)&peVar5->red_y + 1));
      auVar13[6] = -(*(char *)((long)&peVar6->red_y + 2) == *(char *)((long)&peVar5->red_y + 2));
      auVar13[7] = -(*(char *)((long)&peVar6->red_y + 3) == *(char *)((long)&peVar5->red_y + 3));
      auVar13[8] = -(*(char *)&peVar6->green_x == *(char *)&peVar5->green_x);
      auVar13[9] = -(*(char *)((long)&peVar6->green_x + 1) == *(char *)((long)&peVar5->green_x + 1))
      ;
      auVar13[10] = -(*(char *)((long)&peVar6->green_x + 2) == *(char *)((long)&peVar5->green_x + 2)
                     );
      auVar13[0xb] = -(*(char *)((long)&peVar6->green_x + 3) ==
                      *(char *)((long)&peVar5->green_x + 3));
      auVar13[0xc] = -(*(char *)&peVar6->green_y == *(char *)&peVar5->green_y);
      auVar13[0xd] = -(*(char *)((long)&peVar6->green_y + 1) ==
                      *(char *)((long)&peVar5->green_y + 1));
      auVar13[0xe] = -(*(char *)((long)&peVar6->green_y + 2) ==
                      *(char *)((long)&peVar5->green_y + 2));
      auVar13[0xf] = -(*(char *)((long)&peVar6->green_y + 3) ==
                      *(char *)((long)&peVar5->green_y + 3));
      auVar11[0] = -(*(char *)&peVar6->blue_x == *(char *)&peVar5->blue_x);
      auVar11[1] = -(*(char *)((long)&peVar6->blue_x + 1) == *(char *)((long)&peVar5->blue_x + 1));
      auVar11[2] = -(*(char *)((long)&peVar6->blue_x + 2) == *(char *)((long)&peVar5->blue_x + 2));
      auVar11[3] = -(*(char *)((long)&peVar6->blue_x + 3) == *(char *)((long)&peVar5->blue_x + 3));
      auVar11[4] = -(*(char *)&peVar6->blue_y == *(char *)&peVar5->blue_y);
      auVar11[5] = -(*(char *)((long)&peVar6->blue_y + 1) == *(char *)((long)&peVar5->blue_y + 1));
      auVar11[6] = -(*(char *)((long)&peVar6->blue_y + 2) == *(char *)((long)&peVar5->blue_y + 2));
      auVar11[7] = -(*(char *)((long)&peVar6->blue_y + 3) == *(char *)((long)&peVar5->blue_y + 3));
      auVar11[8] = -(*(char *)&peVar6->white_x == *(char *)&peVar5->white_x);
      auVar11[9] = -(*(char *)((long)&peVar6->white_x + 1) == *(char *)((long)&peVar5->white_x + 1))
      ;
      auVar11[10] = -(*(char *)((long)&peVar6->white_x + 2) == *(char *)((long)&peVar5->white_x + 2)
                     );
      auVar11[0xb] = -(*(char *)((long)&peVar6->white_x + 3) ==
                      *(char *)((long)&peVar5->white_x + 3));
      auVar11[0xc] = -(*(char *)&peVar6->white_y == *(char *)&peVar5->white_y);
      auVar11[0xd] = -(*(char *)((long)&peVar6->white_y + 1) ==
                      *(char *)((long)&peVar5->white_y + 1));
      auVar11[0xe] = -(*(char *)((long)&peVar6->white_y + 2) ==
                      *(char *)((long)&peVar5->white_y + 2));
      auVar11[0xf] = -(*(char *)((long)&peVar6->white_y + 3) ==
                      *(char *)((long)&peVar5->white_y + 3));
      auVar11 = auVar11 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00133b75;
    }
  }
  else if (eVar8 != 0) goto LAB_00133b75;
  iVar9 = iVar9 + 1;
  mismatchattr[uVar10] = "chromaticities";
LAB_00133b75:
  *local_38 = iVar9;
  return (uint)(iVar9 != 0) << 4;
}

Assistant:

exr_result_t
internal_exr_validate_shared_attrs (exr_context_t ctxt,
                                    exr_priv_part_t basepart,
                                    exr_priv_part_t curpart,
                                    int curpartidx,
                                    const char **mismatchattr,
                                    int *mismatchcount)
{
    exr_result_t rv, rv1;
    const exr_attribute_t *battr, *cattr;
    int misidx = 0;

    rv = EXR_ERR_SUCCESS;
    if (basepart->displayWindow)
    {
        if (curpart->displayWindow)
        {
            if (basepart->displayWindow->type != EXR_ATTR_BOX2I ||
                basepart->displayWindow->type !=
                curpart->displayWindow->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (basepart->displayWindow->box2i,
                             curpart->displayWindow->box2i,
                             sizeof(exr_attr_box2i_t)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->displayWindow)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;

    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_DISP_STR;

    rv = EXR_ERR_SUCCESS;
    if (basepart->pixelAspectRatio)
    {
        if (curpart->pixelAspectRatio)
        {
            if (basepart->pixelAspectRatio->type != EXR_ATTR_FLOAT ||
                basepart->pixelAspectRatio->type !=
                curpart->pixelAspectRatio->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (&(basepart->pixelAspectRatio->f),
                             &(curpart->pixelAspectRatio->f),
                             sizeof(float)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->pixelAspectRatio)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_PAR_STR;

    rv = exr_get_attribute_by_name (ctxt, 0, "timecode", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "timecode", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_TIMECODE ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->timecode,
                         cattr->timecode,
                         sizeof(exr_attr_timecode_t)))
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "timecode";

    rv = exr_get_attribute_by_name (ctxt, 0, "chromaticities", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "chromaticities", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_CHROMATICITIES ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->chromaticities,
                         cattr->chromaticities,
                         sizeof(exr_attr_chromaticities_t)))
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "chromaticities";

    *mismatchcount = misidx;
    return misidx == 0 ? EXR_ERR_SUCCESS : EXR_ERR_ATTR_TYPE_MISMATCH;
}